

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall
CDirectiveFile::initCopy(CDirectiveFile *this,path *inputName,path *outputName,int64_t memory)

{
  FileManager *this_00;
  path fullOutputName;
  path fullInputName;
  __shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [48];
  path local_40;
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 3;
  getFullPathName(&local_40,inputName);
  getFullPathName((path *)(local_70 + 0x10),outputName);
  std::make_shared<GenericAssemblerFile,ghc::filesystem::path&,ghc::filesystem::path&,long&>
            ((path *)local_70,(path *)(local_70 + 0x10),(long *)&local_40);
  std::__shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  this_00 = g_fileManager;
  std::__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<GenericAssemblerFile,void>
            (local_80,&(this->file).
                       super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
  FileManager::addFile(this_00,(shared_ptr<AssemblerFile> *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  Global.Section = Global.Section + 1;
  (this->super_CAssemblerCommand).section = Global.Section;
  ghc::filesystem::path::~path((path *)(local_70 + 0x10));
  ghc::filesystem::path::~path(&local_40);
  return;
}

Assistant:

void CDirectiveFile::initCopy(const fs::path& inputName, const fs::path& outputName, int64_t memory)
{
	type = Type::Copy;
	fs::path fullInputName = getFullPathName(inputName);
	fs::path fullOutputName = getFullPathName(outputName);
	
	file = std::make_shared<GenericAssemblerFile>(fullOutputName,fullInputName,memory);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}